

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O2

int Gia_ManSopToAig(Gia_Man_t *p,char *pSop,Vec_Int_t *vLeaves)

{
  uint __line;
  long lVar1;
  int iVar2;
  int iVar3;
  int iLit1;
  int Lit;
  byte *pbVar4;
  char *__assertion;
  byte bVar5;
  int i;
  long lVar6;
  
  iVar2 = Kit_PlaGetVarNum(pSop);
  Lit = 0;
  pbVar4 = (byte *)pSop;
  do {
    bVar5 = *pbVar4;
    if (bVar5 == 0) {
      iVar2 = Kit_PlaIsComplement(pSop);
      if (iVar2 != 0) {
        iVar2 = Abc_LitNot(Lit);
        return iVar2;
      }
      return Lit;
    }
    lVar6 = 0;
    iLit1 = 1;
    while ((bVar5 & 0xdf) != 0) {
      i = (int)lVar6;
      iVar3 = Vec_IntEntry(vLeaves,i);
      if (iVar3 < 0) {
        __assertion = "Vec_IntEntry(vLeaves, i) >= 0";
        __line = 0x54;
LAB_005db433:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFx.c"
                      ,__line,"int Gia_ManSopToAig(Gia_Man_t *, char *, Vec_Int_t *)");
      }
      if (bVar5 != 0x2d) {
        if (bVar5 == 0x30) {
          iVar3 = Vec_IntEntry(vLeaves,i);
          iVar3 = Abc_LitNot(iVar3);
        }
        else {
          if (bVar5 != 0x31) {
            __assertion = "Value == \'-\'";
            __line = 0x59;
            goto LAB_005db433;
          }
          iVar3 = Vec_IntEntry(vLeaves,i);
        }
        iLit1 = Gia_ManHashAnd(p,iLit1,iVar3);
      }
      lVar1 = lVar6 + 1;
      lVar6 = lVar6 + 1;
      bVar5 = pbVar4[lVar1];
    }
    Lit = Gia_ManHashOr(p,Lit,iLit1);
    pbVar4 = pbVar4 + (iVar2 + 3);
  } while( true );
}

Assistant:

int Gia_ManSopToAig( Gia_Man_t * p, char * pSop, Vec_Int_t * vLeaves )
{
    int i, iAnd, iSum, Value, nFanins;
    char * pCube;
    // get the number of variables
    nFanins = Kit_PlaGetVarNum(pSop);
    // go through the cubes of the node's SOP
    iSum = 0;
    Kit_PlaForEachCube( pSop, nFanins, pCube )
    {
        // create the AND of literals
        iAnd = 1;
        Kit_PlaCubeForEachVar( pCube, Value, i )
        {
            assert( Vec_IntEntry(vLeaves, i) >= 0 );
            if ( Value == '1' )
                iAnd = Gia_ManHashAnd( p, iAnd, Vec_IntEntry(vLeaves, i) );
            else if ( Value == '0' )
                iAnd = Gia_ManHashAnd( p, iAnd, Abc_LitNot(Vec_IntEntry(vLeaves, i)) );
            else assert( Value == '-' );
        }
        // add to the sum of cubes
        iSum = Gia_ManHashOr( p, iSum, iAnd );
    }
    // decide whether to complement the result
    if ( Kit_PlaIsComplement(pSop) )
        iSum = Abc_LitNot(iSum);
    return iSum;
}